

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall
Population::Population(Population *this,int amount,string *modelName,Parameters *param)

{
  bool bVar1;
  undefined1 uVar2;
  iaf_psc_alpha_param *param_00;
  int in_ESI;
  undefined8 *in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  value_type *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *this_00;
  Izhikevich_param *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int n_neuronID;
  long in_stack_fffffffffffffed8;
  iaf_psc_alpha *in_stack_fffffffffffffee0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff18;
  SignalGenerator *in_stack_ffffffffffffff20;
  int local_b0;
  int local_ac;
  int local_7c;
  int local_6c;
  int local_5c;
  int local_4c;
  int local_3c;
  int local_30;
  
  *in_RDI = &PTR_update_001278f8;
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            ((vector<Event_*,_std::allocator<Event_*>_> *)0x1131ad);
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  std::vector<Neuron_*,_std::allocator<Neuron_*>_>::vector
            ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)0x1131d4);
  *(int *)(in_RDI + 4) = in_ESI;
  local_ac = in_ESI;
  if (*(int *)(in_RDI + 5) != 0) {
    local_ac = *(int *)(in_RDI + 5);
  }
  *(int *)(in_RDI + 5) = local_ac;
  local_b0 = in_ESI;
  if (*(int *)((long)in_RDI + 0x24) != 0) {
    local_b0 = *(int *)((long)in_RDI + 0x24);
  }
  *(int *)((long)in_RDI + 0x24) = local_b0;
  initialize((Population *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  bVar1 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  if (bVar1) {
    for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
      operator_new(0x50);
      LIF::LIF((LIF *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (LIF_param *)in_stack_fffffffffffffec8);
      std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
        operator_new(0x60);
        Izhikevich::Izhikevich
                  ((Izhikevich *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
        std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                  ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
      }
    }
    else {
      uVar2 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      if ((bool)uVar2) {
        for (local_4c = 0; local_4c < in_ESI; local_4c = local_4c + 1) {
          operator_new(0x60);
          CurrentGenerator::CurrentGenerator
                    ((CurrentGenerator *)in_stack_ffffffffffffff20,
                     (CurrentGenerator_param *)CONCAT17(uVar2,in_stack_ffffffffffffff18));
          std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                    ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8);
        }
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        if (bVar1) {
          for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
            operator_new(0x60);
            SignalGenerator::SignalGenerator
                      (in_stack_ffffffffffffff20,
                       (SignalGenerator_param *)CONCAT17(uVar2,in_stack_ffffffffffffff18));
            std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                      ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffeb8);
          }
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
          if (bVar1) {
            for (local_6c = 0; local_6c < in_ESI; local_6c = local_6c + 1) {
              operator_new(0x48);
              PassThrough::PassThrough
                        ((PassThrough *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (PassThrough_param *)in_stack_fffffffffffffec8);
              std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                        ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
            }
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
            n_neuronID = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
            if (bVar1) {
              for (local_7c = 0; local_7c < in_ESI; local_7c = local_7c + 1) {
                this_00 = (vector<Neuron_*,_std::allocator<Neuron_*>_> *)(in_RDI + 6);
                param_00 = (iaf_psc_alpha_param *)operator_new(0x118);
                iaf_psc_alpha::iaf_psc_alpha
                          (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,n_neuronID,param_00);
                std::vector<Neuron_*,_std::allocator<Neuron_*>_>::push_back
                          (this_00,in_stack_fffffffffffffeb8);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

Population(int amount, std::string modelName, Parameters* param) {
        numberOfNeurons = amount;
        numberOfOutputNeurons = numberOfOutputNeurons == 0? amount : numberOfOutputNeurons;
        numberOfInputNeurons = numberOfInputNeurons == 0? amount : numberOfInputNeurons;
        initialize();
        if(modelName == "iaf") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new LIF(static_cast<LIF_param*>(param)));
            }
        }
        else if(modelName == "izhikevich") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new Izhikevich((long)this, i, static_cast<Izhikevich_param*>(param)));
            }
        }
        else if(modelName == "CurrentGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new CurrentGenerator(static_cast<CurrentGenerator_param*>(param)));
            }
        }
        else if(modelName == "SignalGenerator") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new SignalGenerator(static_cast<SignalGenerator_param*>(param)));
            }
        }
        else if(modelName == "PassThrough") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new PassThrough(static_cast<PassThrough_param*>(param)));
            }
        }
        else if(modelName == "iaf_psc_alpha") {
            for(int i = 0; i < amount; i++) {
                neurons.push_back(new iaf_psc_alpha((long)this, i, static_cast<iaf_psc_alpha_param*>(param)));
            }
        }
        else {
            // TODOS throw exception
        }
    }